

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBPolynomialRow_SSE2(uint8_t *src_argb,uint8_t *dst_argb,float *poly,int width)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint uVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  uint6 uVar34;
  ushort uVar35;
  short sVar36;
  float fVar37;
  int iVar38;
  float fVar45;
  int iVar46;
  float fVar47;
  int iVar48;
  float fVar49;
  int iVar50;
  float fVar51;
  int iVar52;
  float fVar53;
  int iVar54;
  float fVar55;
  int iVar56;
  float fVar57;
  int iVar58;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined4 uVar39;
  undefined6 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar44 [16];
  
  do {
    uVar1 = *(ulong *)src_argb;
    src_argb = (uint8_t *)((long)src_argb + 8);
    auVar18._8_6_ = 0;
    auVar18._0_8_ = uVar1;
    auVar18[0xe] = (char)(uVar1 >> 0x38);
    auVar20._8_4_ = 0;
    auVar20._0_8_ = uVar1;
    auVar20[0xc] = (char)(uVar1 >> 0x30);
    auVar20._13_2_ = auVar18._13_2_;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = uVar1;
    auVar21._12_3_ = auVar20._12_3_;
    uVar22 = auVar21._11_4_;
    auVar23._8_2_ = 0;
    auVar23._0_8_ = uVar1;
    auVar23[10] = (char)(uVar1 >> 0x28);
    auVar23._11_4_ = uVar22;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24._10_5_ = auVar23._10_5_;
    auVar25[8] = (char)(uVar1 >> 0x20);
    auVar25._0_8_ = uVar1;
    auVar25._9_6_ = auVar24._9_6_;
    auVar27._7_8_ = 0;
    auVar27._0_7_ = auVar25._8_7_;
    Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar32._9_6_ = 0;
    auVar32._0_9_ = Var28;
    auVar29._1_10_ = SUB1510(auVar32 << 0x30,5);
    auVar29[0] = (char)(uVar1 >> 0x10);
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar29;
    auVar30._1_12_ = SUB1512(auVar33 << 0x20,3);
    auVar30[0] = (char)(uVar1 >> 8);
    uVar35 = CONCAT11(0,(byte)uVar1);
    auVar26._2_13_ = auVar30;
    auVar26._0_2_ = uVar35;
    auVar19._10_2_ = 0;
    auVar19._0_10_ = auVar26._0_10_;
    auVar19._12_2_ = (short)Var28;
    uVar34 = CONCAT42(auVar19._10_4_,auVar29._0_2_);
    auVar31._6_8_ = 0;
    auVar31._0_6_ = uVar34;
    fVar37 = (float)uVar35;
    fVar45 = (float)(int)CONCAT82(SUB148(auVar31 << 0x40,6),auVar30._0_2_);
    fVar47 = (float)(int)uVar34;
    fVar49 = (float)(auVar19._10_4_ >> 0x10);
    fVar51 = (float)auVar25._8_2_;
    fVar53 = (float)auVar23._10_2_;
    fVar55 = (float)(uVar22 >> 8 & 0xffff);
    fVar57 = (float)(uVar22 >> 0x18);
    iVar38 = (int)(fVar37 * poly[4] + *poly + fVar37 * fVar37 * poly[8] +
                  fVar37 * fVar37 * fVar37 * poly[0xc]);
    iVar46 = (int)(fVar45 * poly[5] + poly[1] + fVar45 * fVar45 * poly[9] +
                  fVar45 * fVar45 * fVar45 * poly[0xd]);
    iVar48 = (int)(fVar47 * poly[6] + poly[2] + fVar47 * fVar47 * poly[10] +
                  fVar47 * fVar47 * fVar47 * poly[0xe]);
    iVar50 = (int)(fVar49 * poly[7] + poly[3] + fVar49 * fVar49 * poly[0xb] +
                  fVar49 * fVar49 * fVar49 * poly[0xf]);
    iVar52 = (int)(fVar51 * poly[4] + *poly + fVar51 * fVar51 * poly[8] +
                  fVar51 * fVar51 * fVar51 * poly[0xc]);
    iVar54 = (int)(fVar53 * poly[5] + poly[1] + fVar53 * fVar53 * poly[9] +
                  fVar53 * fVar53 * fVar53 * poly[0xd]);
    iVar56 = (int)(fVar55 * poly[6] + poly[2] + fVar55 * fVar55 * poly[10] +
                  fVar55 * fVar55 * fVar55 * poly[0xe]);
    iVar58 = (int)(fVar57 * poly[7] + poly[3] + fVar57 * fVar57 * poly[0xb] +
                  fVar57 * fVar57 * fVar57 * poly[0xf]);
    sVar11 = (short)iVar38;
    cVar3 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar38 - (0xff < sVar11);
    sVar11 = (short)((uint)iVar38 >> 0x10);
    sVar36 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar38 >> 0x10) -
                      (0xff < sVar11),cVar3);
    sVar11 = (short)iVar46;
    cVar4 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar46 - (0xff < sVar11);
    sVar11 = (short)((uint)iVar46 >> 0x10);
    uVar39 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar46 >> 0x10) -
                      (0xff < sVar11),CONCAT12(cVar4,sVar36));
    sVar11 = (short)iVar48;
    cVar5 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar48 - (0xff < sVar11);
    sVar11 = (short)((uint)iVar48 >> 0x10);
    uVar40 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar48 >> 0x10) -
                      (0xff < sVar11),CONCAT14(cVar5,uVar39));
    sVar11 = (short)iVar50;
    cVar6 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar50 - (0xff < sVar11);
    sVar11 = (short)((uint)iVar50 >> 0x10);
    uVar41 = CONCAT17((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar50 >> 0x10) -
                      (0xff < sVar11),CONCAT16(cVar6,uVar40));
    sVar11 = (short)iVar52;
    cVar7 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar52 - (0xff < sVar11);
    sVar11 = (short)((uint)iVar52 >> 0x10);
    auVar42._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar52 >> 0x10) - (0xff < sVar11),
                  CONCAT18(cVar7,uVar41));
    sVar11 = (short)iVar54;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar54 - (0xff < sVar11);
    auVar42[10] = cVar8;
    sVar11 = (short)((uint)iVar54 >> 0x10);
    auVar42[0xb] = (0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar54 >> 0x10) - (0xff < sVar11);
    sVar11 = (short)iVar56;
    cVar9 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar56 - (0xff < sVar11);
    auVar43[0xc] = cVar9;
    auVar43._0_12_ = auVar42;
    sVar11 = (short)((uint)iVar56 >> 0x10);
    auVar43[0xd] = (0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar56 >> 0x10) - (0xff < sVar11);
    sVar11 = (short)iVar58;
    cVar10 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar58 - (0xff < sVar11);
    auVar44[0xe] = cVar10;
    auVar44._0_14_ = auVar43;
    sVar11 = (short)((uint)iVar58 >> 0x10);
    auVar44[0xf] = (0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar58 >> 0x10) - (0xff < sVar11);
    sVar11 = (short)((uint)uVar39 >> 0x10);
    sVar12 = (short)((uint6)uVar40 >> 0x20);
    sVar13 = (short)((ulong)uVar41 >> 0x30);
    sVar14 = (short)((unkuint10)auVar42._0_10_ >> 0x40);
    sVar15 = auVar42._10_2_;
    sVar16 = auVar43._12_2_;
    sVar17 = auVar44._14_2_;
    *(ulong *)dst_argb =
         CONCAT17((0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17),
                  CONCAT16((0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16),
                           CONCAT15((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                                    CONCAT14((0 < sVar14) * (sVar14 < 0x100) * cVar7 -
                                             (0xff < sVar14),
                                             CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar6 -
                                                      (0xff < sVar13),
                                                      CONCAT12((0 < sVar12) * (sVar12 < 0x100) *
                                                               cVar5 - (0xff < sVar12),
                                                               CONCAT11((0 < sVar11) *
                                                                        (sVar11 < 0x100) * cVar4 -
                                                                        (0xff < sVar11),
                                                                        (0 < sVar36) *
                                                                        (sVar36 < 0x100) * cVar3 -
                                                                        (0xff < sVar36))))))));
    dst_argb = dst_argb + 8;
    iVar38 = width + -2;
    bVar2 = 1 < width;
    width = iVar38;
  } while (iVar38 != 0 && bVar2);
  return;
}

Assistant:

void ARGBPolynomialRow_SSE2(const uint8_t* src_argb,
                            uint8_t* dst_argb,
                            const float* poly,
                            int width) {
  asm volatile(

      "pxor        %%xmm3,%%xmm3                 \n"

      // 2 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movq        (%0),%%xmm0                   \n"
      "lea         0x8(%0),%0                    \n"
      "punpcklbw   %%xmm3,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm4                 \n"
      "punpcklwd   %%xmm3,%%xmm0                 \n"
      "punpckhwd   %%xmm3,%%xmm4                 \n"
      "cvtdq2ps    %%xmm0,%%xmm0                 \n"
      "cvtdq2ps    %%xmm4,%%xmm4                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm4,%%xmm5                 \n"
      "mulps       0x10(%3),%%xmm0               \n"
      "mulps       0x10(%3),%%xmm4               \n"
      "addps       (%3),%%xmm0                   \n"
      "addps       (%3),%%xmm4                   \n"
      "movdqa      %%xmm1,%%xmm2                 \n"
      "movdqa      %%xmm5,%%xmm6                 \n"
      "mulps       %%xmm1,%%xmm2                 \n"
      "mulps       %%xmm5,%%xmm6                 \n"
      "mulps       %%xmm2,%%xmm1                 \n"
      "mulps       %%xmm6,%%xmm5                 \n"
      "mulps       0x20(%3),%%xmm2               \n"
      "mulps       0x20(%3),%%xmm6               \n"
      "mulps       0x30(%3),%%xmm1               \n"
      "mulps       0x30(%3),%%xmm5               \n"
      "addps       %%xmm2,%%xmm0                 \n"
      "addps       %%xmm6,%%xmm4                 \n"
      "addps       %%xmm1,%%xmm0                 \n"
      "addps       %%xmm5,%%xmm4                 \n"
      "cvttps2dq   %%xmm0,%%xmm0                 \n"
      "cvttps2dq   %%xmm4,%%xmm4                 \n"
      "packuswb    %%xmm4,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x2,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "r"(poly)        // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}